

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::DoLoadClusterUnknownSize(Segment *this,longlong *pos,long *len)

{
  long lVar1;
  longlong lVar2;
  long *in_RSI;
  long in_RDI;
  longlong size;
  longlong start;
  long status;
  long *in_stack_00000048;
  longlong *in_stack_00000050;
  Cluster *in_stack_00000058;
  undefined8 local_8;
  
  if ((*(long *)(in_RDI + 0x68) < 0) && (*(long *)(in_RDI + 0x70) != 0)) {
    local_8 = Cluster::Parse(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (-1 < local_8) {
      if (local_8 == 0) {
        local_8 = 2;
      }
      else {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x70) + 8);
        lVar2 = Cluster::GetElementSize(*(Cluster **)(in_RDI + 0x70));
        if (lVar2 < 0) {
          local_8 = -2;
        }
        else {
          *in_RSI = lVar1 + lVar2;
          *(long *)(in_RDI + 0x68) = *in_RSI;
          *(undefined8 *)(in_RDI + 0x70) = 0;
          local_8 = 2;
        }
      }
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long Segment::DoLoadClusterUnknownSize(long long& pos, long& len) {
  if (m_pos >= 0 || m_pUnknownSize == NULL)
    return E_PARSE_FAILED;

  const long status = m_pUnknownSize->Parse(pos, len);

  if (status < 0)  // error or underflow
    return status;

  if (status == 0)  // parsed a block
    return 2;  // continue parsing

  const long long start = m_pUnknownSize->m_element_start;
  const long long size = m_pUnknownSize->GetElementSize();

  if (size < 0)
    return E_FILE_FORMAT_INVALID;

  pos = start + size;
  m_pos = pos;

  m_pUnknownSize = 0;

  return 2;  // continue parsing
}